

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O3

void __thiscall
sptk::reaper::FdFilter::FdFilterInitialize
          (FdFilter *this,float input_freq,float corner_freq,bool do_highpass,float filter_dur,
          bool do_rate_conversion,char *spectrum_shape,float *spectrum_array,int n_magnitudes)

{
  int *nf;
  float *pfVar1;
  float *pfVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int16_t *piVar6;
  char *pcVar7;
  float *pfVar8;
  FFT *this_00;
  uint uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  FILE *pFVar13;
  FdFilter *this_01;
  int iVar14;
  bool bVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  int n_spect;
  float fs;
  int ind;
  char line [500];
  float *local_268;
  int *local_240;
  int local_238;
  float local_234;
  int local_230;
  undefined1 local_22c [4];
  char local_228 [504];
  
  this->insert_ = 1;
  this->decimate_ = 1;
  this->array_leftover_ = 0;
  this->array_index_ = 0;
  this->array_samples_used_ = 0;
  this->filter_state_ = 1;
  this->true_output_rate_ = input_freq;
  piVar6 = (int16_t *)operator_new__(44000);
  this->output_buffer_ = piVar6;
  pFVar13 = (FILE *)0x55f0;
  piVar6 = (int16_t *)operator_new__(22000);
  this->input_buffer_ = piVar6;
  if (spectrum_shape == (char *)0x0) {
    bVar15 = 1 < n_magnitudes && spectrum_array != (float *)0x0;
    if ((1 >= n_magnitudes || spectrum_array == (float *)0x0) && !do_rate_conversion) {
      if (input_freq * 0.5 <= corner_freq) {
        pFVar13 = _stderr;
        fprintf(_stderr,"Unreasonable corner frequency specified to filter() (%f)\n");
      }
      bVar15 = false;
    }
    bVar3 = n_magnitudes < 2 || spectrum_array == (float *)0x0;
    if (n_magnitudes < 2 || spectrum_array == (float *)0x0) {
      fVar21 = corner_freq / input_freq;
      if (do_rate_conversion) {
        RationalApproximation((FdFilter *)pFVar13,fVar21,&this->insert_,&this->decimate_,0xc);
        uVar17._0_4_ = this->insert_;
        uVar17._4_4_ = this->decimate_;
        fVar20 = (float)(int)(undefined4)uVar17;
        fVar21 = fVar20 / (float)(int)uVar17._4_4_;
        if (ABS(1.0 - fVar21) < 0.01) {
          fwrite("Input and output frequencies are essentially equal!\n",0x34,1,_stderr);
          uVar9 = this->insert_;
          uVar17 = (ulong)uVar9;
          fVar20 = (float)(int)uVar9;
        }
        fVar21 = fVar21 * input_freq;
        this->true_output_rate_ = fVar21;
        fVar20 = fVar20 * input_freq;
        uVar9 = (int)(filter_dur * fVar20) | 1;
        this->n_filter_coeffs_ = uVar9;
        if (input_freq <= fVar21) {
          fVar20 = (float)(int)uVar17;
          fVar21 = 0.5;
        }
        else {
          fVar21 = fVar21 * 0.5;
        }
        fVar21 = fVar21 / fVar20;
      }
      else {
        uVar9 = (int)(input_freq * filter_dur) | 1;
        this->n_filter_coeffs_ = uVar9;
      }
      nf = &this->n_filter_coeffs_;
      this_01 = (FdFilter *)0xffffffffffffffff;
      if (-4 < (int)uVar9) {
        this_01 = (FdFilter *)((long)((int)uVar9 / 2) * 4 + 4);
      }
      spectrum_array = (float *)operator_new__((ulong)this_01);
      MakeLinearFir(this_01,fVar21,nf,spectrum_array);
      iVar11 = this->insert_;
      if (iVar11 < 2) {
        iVar4 = *nf;
      }
      else {
        iVar4 = *nf;
        if (-2 < iVar4) {
          uVar17 = (ulong)(uint)(iVar4 / 2);
          do {
            spectrum_array[uVar17] = spectrum_array[uVar17] * (float)iVar11;
            bVar19 = uVar17 != 0;
            uVar17 = uVar17 - 1;
          } while (bVar19);
        }
      }
    }
    else {
      iVar4 = n_magnitudes + -1;
      this->n_filter_coeffs_ = iVar4;
    }
    this->n_filter_coeffs_by2_ = iVar4 / 2;
    if (!bVar15) {
      MirrorFilter(this,spectrum_array,do_highpass);
      iVar4 = this->n_filter_coeffs_ * 2;
      this->fft_size_ = 0x80;
      if (iVar4 < 0x81) {
        iVar16 = 7;
        iVar11 = 0x80;
      }
      else {
        iVar16 = 7;
        iVar5 = 0x80;
        do {
          iVar11 = iVar5 * 2;
          iVar16 = iVar16 + 1;
          iVar14 = iVar5 * -2;
          iVar5 = iVar11;
        } while (iVar4 != iVar11 && SBORROW4(iVar4,iVar11) == iVar4 + iVar14 < 0);
        this->fft_size_ = iVar11;
      }
      bVar15 = false;
      local_268 = spectrum_array;
      goto LAB_001121ad;
    }
  }
  else {
    pFVar13 = fopen(spectrum_shape,"r");
    if (pFVar13 == (FILE *)0x0) {
      spectrum_array = (float *)0x0;
      fprintf(_stderr,"Can\'t open %s as a spectrum file\n",spectrum_shape);
    }
    else {
      pcVar7 = fgets(local_228,500,pFVar13);
      if (pcVar7 == (char *)0x0) {
        spectrum_array = (float *)0x0;
        fprintf(_stderr,"Bad format in spectrum file %s\n",spectrum_shape);
      }
      else {
        iVar4 = __isoc99_sscanf(local_228,"%d %d %f",&local_230,&local_238);
        if ((iVar4 == 3) && ((local_234 != input_freq || (NAN(local_234) || NAN(input_freq))))) {
          FdFilterInitialize();
        }
        iVar4 = local_238;
        lVar10 = (long)local_238;
        uVar17 = 0xffffffffffffffff;
        if (-1 < lVar10) {
          uVar17 = lVar10 * 4;
        }
        spectrum_array = (float *)operator_new__(uVar17);
        this->n_filter_coeffs_ = iVar4 + -1;
        if (0 < lVar10) {
          lVar10 = 0;
          pfVar8 = spectrum_array;
          do {
            pcVar7 = fgets(local_228,500,pFVar13);
            if ((pcVar7 == (char *)0x0) ||
               (iVar4 = __isoc99_sscanf(local_228,"%d %f",local_22c,pfVar8), iVar4 != 2)) {
              fprintf(_stderr,"Parsing error in spect ratio file %s\n",spectrum_shape);
            }
            lVar10 = lVar10 + 1;
            pfVar8 = pfVar8 + 1;
          } while (lVar10 < local_238);
        }
      }
      fclose(pFVar13);
    }
    iVar4 = this->n_filter_coeffs_;
    this->n_filter_coeffs_by2_ = iVar4 / 2;
    bVar3 = true;
  }
  iVar11 = iVar4 * 2;
  this->fft_size_ = iVar11;
  iVar16 = 1;
  do {
    iVar16 = iVar16 + 1;
    iVar5 = 1 << ((byte)iVar16 & 0x1f);
  } while (SBORROW4(iVar5,iVar11) != iVar5 + iVar4 * -2 < 0);
  bVar15 = true;
  local_268 = spectrum_array;
LAB_001121ad:
  local_240 = &this->n_filter_coeffs_;
  this->fft_size_by2_ = iVar11 >> 1;
  uVar17 = (long)iVar11 * 4;
  if (iVar11 < 0) {
    uVar17 = 0xffffffffffffffff;
  }
  uVar18 = (long)iVar11 * 2;
  if (iVar11 < 0) {
    uVar18 = 0xffffffffffffffff;
  }
  local_230 = iVar16;
  pfVar8 = (float *)operator_new__(uVar17);
  this->x_ = pfVar8;
  pfVar8 = (float *)operator_new__(uVar17);
  this->y_ = pfVar8;
  pfVar8 = (float *)operator_new__(uVar17);
  this->xf_ = pfVar8;
  pfVar8 = (float *)operator_new__(uVar17);
  this->yf_ = pfVar8;
  piVar6 = (int16_t *)operator_new__(uVar18);
  this->leftovers_ = piVar6;
  this->max_input_ = (int)(11000 / (long)this->insert_);
  iVar4 = this->n_filter_coeffs_ + iVar11 + 22000;
  uVar17 = (long)iVar4 * 4;
  if (iVar4 < 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pfVar8 = (float *)operator_new__(uVar17);
  this->output_delayed_ = pfVar8;
  this_00 = (FFT *)operator_new(0x20);
  FFT::FFT(this_00,iVar16);
  fVar21 = 1.0 / (float)iVar11;
  this->fft_ = this_00;
  if (bVar15) {
    if (*local_240 < 0) {
      lVar10 = 0;
    }
    else {
      pfVar8 = this->xf_;
      pfVar1 = this->yf_;
      lVar10 = (ulong)(uint)*local_240 + 1;
      lVar12 = 0;
      do {
        pfVar8[lVar12] = local_268[lVar12] * fVar21;
        pfVar1[lVar12] = 0.0;
        lVar12 = lVar12 + 1;
      } while (lVar10 != lVar12);
    }
    if ((int)lVar10 < this->fft_size_) {
      pfVar8 = this->xf_;
      pfVar1 = this->yf_;
      lVar10 = (long)(int)lVar10;
      lVar12 = this->fft_size_ - lVar10;
      do {
        pfVar8[lVar10] = pfVar8[lVar12];
        pfVar1[lVar10] = 0.0;
        lVar10 = lVar10 + 1;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
  }
  else {
    uVar9 = this->n_filter_coeffs_by2_;
    pfVar8 = this->xf_;
    pfVar1 = this->yf_;
    if ((int)uVar9 < 0) {
      lVar10 = 0;
    }
    else {
      lVar10 = (ulong)uVar9 + 1;
      pfVar2 = this->filter_coeffs_;
      lVar12 = 0;
      do {
        pfVar8[lVar12] = pfVar2[(ulong)uVar9 + lVar12] * fVar21;
        pfVar1[lVar12] = 0.0;
        lVar12 = lVar12 + 1;
      } while (lVar10 != lVar12);
    }
    iVar4 = this->n_filter_coeffs_;
    iVar11 = this->fft_size_;
    iVar16 = (int)lVar10;
    if (iVar16 < iVar4) {
      pfVar2 = this->filter_coeffs_;
      iVar5 = (iVar11 + iVar16) - iVar4;
      iVar14 = ~uVar9 + iVar16;
      lVar10 = (long)iVar4 - (long)iVar16;
      do {
        pfVar8[iVar5] = pfVar2[iVar14] * fVar21;
        pfVar1[iVar5] = 0.0;
        iVar5 = iVar5 + 1;
        iVar14 = iVar14 + 1;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    if ((int)uVar9 < (int)(iVar11 - uVar9)) {
      lVar10 = (long)(int)uVar9;
      lVar12 = 0;
      do {
        pfVar1[lVar10 + lVar12] = 0.0;
        pfVar8[lVar10 + lVar12] = 0.0;
        lVar12 = lVar12 + 1;
      } while ((long)iVar11 + lVar10 * -2 != lVar12);
    }
    FFT::fft(this_00,pfVar8,pfVar1);
  }
  if (bVar3 && local_268 != (float *)0x0) {
    operator_delete__(local_268);
  }
  return;
}

Assistant:

void FdFilter::FdFilterInitialize(float input_freq, float corner_freq,
                                  bool do_highpass, float filter_dur,
                                  bool do_rate_conversion,
                                  char *spectrum_shape, float *spectrum_array,
                                  int n_magnitudes) {
  float beta = 0.0, *b = NULL;
  float  ratio_t, ratio, freq1 = input_freq;
  int pow2, i;
  bool do_eq_filtering = false;
  bool b_allocated = true;

  insert_ = 1;
  decimate_ = 1;
  filter_state_ = 1;
  array_leftover_ = 0;
  array_index_ = 0;
  array_samples_used_ = 0;
  true_output_rate_ = input_freq;

  output_buffer_ = new int16_t[kIoBufferSize * 2];
  input_buffer_ = new int16_t[kIoBufferSize];

  if (spectrum_shape || (spectrum_array && (n_magnitudes > 1))) {
    do_eq_filtering = true;
  } else {
    if (do_rate_conversion) {
      freq1 = input_freq;
    } else {   /* it is just a symmetric FIR */
      if (corner_freq >= (freq1 = input_freq) / 2.0) {
        fprintf(stderr,
                "Unreasonable corner frequency specified to filter() (%f)\n",
                corner_freq);
      }
    }
  }

  if (spectrum_shape) {
    FILE *spec_stream = fopen(spectrum_shape, "r");
    if (spec_stream) {
      int n_spect, ind;
      char line[500];
      float fs;
      if (fgets(line, 500, spec_stream)) {
        int nItems = sscanf(line, "%d %d %f", &pow2, &n_spect, &fs);
        if ((nItems == 3) && (fs != input_freq)) {  // This should be a
                                                  // fatal error!
          fprintf(stderr,
                  "Filter spec (%f) does not match input frequency (%f)\n",
                  fs, input_freq);
          fprintf(stderr,
               "The filtering results will probably not be what you want!\n");
        }
        b = new float[n_spect];
        n_filter_coeffs_ = n_spect - 1;  // n_filter_coeffs_ represents actual
                                         // filter-kernel length,
                                         // instead of half filter
                                         // length when using external
                                         // filter.
        for (i = 0; i < n_spect; i++) {
          if ((!fgets(line, 500, spec_stream)) ||
             (sscanf(line, "%d %f", &ind, &(b[i])) != 2)) {
            fprintf(stderr, "Parsing error in spect ratio file %s\n",
                    spectrum_shape);
          }
        }
      } else {
        fprintf(stderr, "Bad format in spectrum file %s\n",
                             spectrum_shape);
      }
      fclose(spec_stream);
    } else {
      fprintf(stderr, "Can't open %s as a spectrum file\n",
                           spectrum_shape);
    }
  } else {
    // Note: n_magnitudes MUST be ((2^k)+1) for k > 1.
    if (spectrum_array && (n_magnitudes > 1)) {
      n_filter_coeffs_ = n_magnitudes - 1;
      int nft = n_filter_coeffs_ * 2;
      pow2 = 1;
      while ((1 << pow2) < nft) {
        pow2++;
      }
      b = spectrum_array;  // Note: b must not be deleted in this case!
      b_allocated = false;
    } else { /* it is not an eq filter */
      if (do_rate_conversion) {
        /* get a ratio of integers close to desired freq. ratio. */
        ratio = corner_freq/freq1;
        RationalApproximation(ratio, &insert_, &decimate_, kMaxDecimation);
        ratio_t = static_cast<float>(insert_) / decimate_;

        if (fabs(1.0 - ratio_t) < .01) {
          fprintf(stderr,
                  "Input and output frequencies are essentially equal!\n");
        }
        true_output_rate_ = ratio_t * freq1;
        // if (corner_freq != true_output_rate_) {
        //   fprintf(stderr,
        // "Warning: Output frequency obtained(%f) is not as requested(%f)\n",
        //    true_output_rate_, corner_freq);
        // }
        corner_freq = true_output_rate_;
        n_filter_coeffs_ = static_cast<int>(freq1 * insert_ * filter_dur) | 1;
        if (corner_freq < freq1)
          beta = (.5 * corner_freq)/(insert_ * freq1);
        else
          beta = .5/insert_;
      } else {
        beta = corner_freq/freq1;
        n_filter_coeffs_ = static_cast<int>(freq1 * filter_dur) | 1;
      }

      /* Generate the symmetric FIR filter coefficients. */
      b = new float[1 + (n_filter_coeffs_ / 2)];
      MakeLinearFir(beta, &n_filter_coeffs_, b);

      if (insert_ > 1) {  // Scale up filter coeffs. to maintain
                        // precision in output.
        float fact = insert_;
        for (i = n_filter_coeffs_ / 2; i >= 0; i--) b[i] *= fact;
      }
    }  // end else it is not an eq filter.
  }  // end else (a spectrum shape was not specified).

  n_filter_coeffs_by2_ = n_filter_coeffs_ / 2;

  if (!do_eq_filtering) { /* Is it a simple high- or low-pass filter? */
    MirrorFilter(b, do_highpass);
    int nf2 = n_filter_coeffs_ << 1;
    fft_size_ = 128;
    pow2 = 7;
    while (nf2 > fft_size_) {
      fft_size_ *= 2;
      pow2++;
    }
  } else {  // It is a filter with the magnitude response specified in b.
    fft_size_ = n_filter_coeffs_ * 2;
    pow2 = 2;
    while ((1 << pow2) < fft_size_)
      pow2++;
  }

  fft_size_by2_ = fft_size_ / 2;

  x_ = new float[fft_size_];
  y_ = new float[fft_size_];
  xf_ = new float[fft_size_];
  yf_ = new float[fft_size_];

  leftovers_ = new int16_t[fft_size_];
  max_input_ = kIoBufferSize / insert_;
  output_delayed_ = new float[(2 * kIoBufferSize)+n_filter_coeffs_+fft_size_];

  float ftscale = 1.0 / fft_size_;
  fft_ = new FFT(pow2);
  if (!do_eq_filtering) {
    // position the filter kernel to be symmetric about time=0
    // Note that this assumes an odd number of symmetric filter coefficients.
    for (i = 0; i <= n_filter_coeffs_by2_; i++) {
      xf_[i] = ftscale * filter_coeffs_[i+n_filter_coeffs_by2_];
      yf_[i] = 0.0;
    }
    for (; i < n_filter_coeffs_; i++) {
      xf_[fft_size_ - n_filter_coeffs_ + i] = ftscale *
           filter_coeffs_[i - n_filter_coeffs_by2_ - 1];
      yf_[fft_size_ - n_filter_coeffs_ + i] = 0.0;
    }
    for (i = n_filter_coeffs_by2_; i < (fft_size_-n_filter_coeffs_by2_); i++)
      xf_[i] = yf_[i] = 0.0;
    fft_->fft(xf_, yf_);
  } else { /* Install the magnitude response symmetrically. */
    for (i = 0; i <= n_filter_coeffs_; i++) {
      xf_[i] = ftscale * b[i];
      yf_[i] = 0.0;
    }
    for (; i < fft_size_; i++) {
      xf_[i] = xf_[fft_size_ - i];
      yf_[i] = 0.0;
    }
  }
  /* The filter, regardless of its origin, is now in the frequency domain. */

  if (b_allocated) {
    delete [] b;
  }
}